

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

void __thiscall FStateDefinitions::MakeStateDefines(FStateDefinitions *this,PClassActor *cls)

{
  TArray<FState,_FState>::Clear(&this->StateArray);
  this->laststate = (FState *)0x0;
  this->laststatebeforelabel = (FState *)0x0;
  this->lastlabel = -1;
  if ((cls != (PClassActor *)0x0) && (cls->StateList != (FStateLabels *)0x0)) {
    MakeStateList(cls->StateList,&this->StateLabels);
    return;
  }
  TArray<FStateDefine,_FStateDefine>::Clear(&this->StateLabels);
  return;
}

Assistant:

void FStateDefinitions::MakeStateDefines(const PClassActor *cls)
{
	StateArray.Clear();
	laststate = NULL;
	laststatebeforelabel = NULL;
	lastlabel = -1;

	if (cls != NULL && cls->StateList != NULL)
	{
		MakeStateList(cls->StateList, StateLabels);
	}
	else
	{
		StateLabels.Clear();
	}
}